

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

WindowQuantileState<duckdb::hugeint_t> * __thiscall
duckdb::QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType>::GetOrCreateWindowState
          (QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *this)

{
  bool bVar1;
  type pWVar2;
  unique_ptr<duckdb::WindowQuantileState<duckdb::hugeint_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::hugeint_t>_>,_true>
  *in_RDI;
  unique_ptr<duckdb::WindowQuantileState<duckdb::hugeint_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::hugeint_t>_>,_true>
  *in_stack_fffffffffffffff0;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::WindowQuantileState<duckdb::hugeint_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::hugeint_t>_>_>
                      *)0xa2aa5b);
  if (!bVar1) {
    make_uniq<duckdb::WindowQuantileState<duckdb::hugeint_t>>();
    unique_ptr<duckdb::WindowQuantileState<duckdb::hugeint_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::hugeint_t>_>,_true>
    ::operator=(in_stack_fffffffffffffff0,in_RDI);
    unique_ptr<duckdb::WindowQuantileState<duckdb::hugeint_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::hugeint_t>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::WindowQuantileState<duckdb::hugeint_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::hugeint_t>_>,_true>
                   *)0xa2aa85);
  }
  pWVar2 = unique_ptr<duckdb::WindowQuantileState<duckdb::hugeint_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::hugeint_t>_>,_true>
           ::operator*(in_stack_fffffffffffffff0);
  return pWVar2;
}

Assistant:

WindowQuantileState<INPUT_TYPE> &GetOrCreateWindowState() {
		if (!window_state) {
			window_state = make_uniq<WindowQuantileState<INPUT_TYPE>>();
		}
		return *window_state;
	}